

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O2

void __thiscall sf::priv::GlContext::cleanupUnsharedResources(GlContext *this)

{
  GlContext *this_00;
  _Rb_tree_node_base *p_Var1;
  
  this_00 = (GlContext *)
            ThreadLocal::getValue
                      ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext);
  setActive(this,true);
  for (p_Var1 = (_Rb_tree_node_base *)
                (anonymous_namespace)::GlContextImpl::contextDestroyCallbacks._24_8_;
      p_Var1 != (_Rb_tree_node_base *)
                ((anonymous_namespace)::GlContextImpl::contextDestroyCallbacks + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(p_Var1 + 1))(p_Var1[1]._M_parent);
  }
  if (this_00 == (GlContext *)0x0 || this_00 == this) {
    return;
  }
  setActive(this_00,true);
  return;
}

Assistant:

void GlContext::cleanupUnsharedResources()
{
    using GlContextImpl::currentContext;
    using GlContextImpl::ContextDestroyCallbacks;
    using GlContextImpl::contextDestroyCallbacks;

    // Save the current context so we can restore it later
    GlContext* contextToRestore = currentContext;

    // If this context is already active there is no need to save it
    if (contextToRestore == this)
        contextToRestore = NULL;

    // Make this context active so resources can be freed
    setActive(true);

    // Call the registered destruction callbacks
    for (ContextDestroyCallbacks::iterator iter = contextDestroyCallbacks.begin(); iter != contextDestroyCallbacks.end(); ++iter)
        iter->first(iter->second);

    // Make the originally active context active again
    if (contextToRestore)
        contextToRestore->setActive(true);
}